

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_clone_alloc(wally_psbt *psbt,uint32_t flags,wally_psbt **output)

{
  int local_34;
  size_t sStack_30;
  int ret;
  size_t is_elements;
  wally_psbt **output_local;
  wally_psbt *pwStack_18;
  uint32_t flags_local;
  wally_psbt *psbt_local;
  
  if (output != (wally_psbt **)0x0) {
    *output = (wally_psbt *)0x0;
  }
  if (((psbt == (wally_psbt *)0x0) || (flags != 0)) || (output == (wally_psbt **)0x0)) {
    psbt_local._4_4_ = -2;
  }
  else {
    is_elements = (size_t)output;
    output_local._4_4_ = flags;
    pwStack_18 = psbt;
    psbt_local._4_4_ = wally_psbt_is_elements(psbt,&stack0xffffffffffffffd0);
    if (psbt_local._4_4_ == 0) {
      if (sStack_30 == 0) {
        local_34 = wally_psbt_init_alloc
                             (pwStack_18->version,pwStack_18->inputs_allocation_len,
                              pwStack_18->outputs_allocation_len,
                              (pwStack_18->unknowns).items_allocation_len,(wally_psbt **)is_elements
                             );
      }
      else {
        local_34 = wally_psbt_elements_init_alloc
                             (pwStack_18->version,pwStack_18->inputs_allocation_len,
                              pwStack_18->outputs_allocation_len,
                              (pwStack_18->unknowns).items_allocation_len,(wally_psbt **)is_elements
                             );
      }
      if (local_34 == 0) {
        *(size_t *)(*(long *)is_elements + 0x18) = pwStack_18->num_inputs;
        *(size_t *)(*(long *)is_elements + 0x30) = pwStack_18->num_outputs;
        local_34 = psbt_combine(*(wally_psbt **)is_elements,pwStack_18);
        if ((local_34 == 0) && (pwStack_18->tx != (wally_tx *)0x0)) {
          local_34 = tx_clone_alloc(pwStack_18->tx,(wally_tx **)(*(long *)is_elements + 8));
        }
        if (local_34 != 0) {
          wally_psbt_free(*(wally_psbt **)is_elements);
          *(undefined8 *)is_elements = 0;
        }
      }
      psbt_local._4_4_ = local_34;
    }
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_clone_alloc(const struct wally_psbt *psbt, uint32_t flags,
                           struct wally_psbt **output)
{
#ifdef BUILD_ELEMENTS
    size_t is_elements;
#endif /* BUILD_ELEMENTS */
    int ret;

    if (output)
        *output = NULL;
    if (!psbt || flags || !output)
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;

    if (is_elements)
        ret = wally_psbt_elements_init_alloc(psbt->version,
                                             psbt->inputs_allocation_len,
                                             psbt->outputs_allocation_len,
                                             psbt->unknowns.items_allocation_len,
                                             output);
    else
#endif /* BUILD_ELEMENTS */
    ret = wally_psbt_init_alloc(psbt->version,
                                psbt->inputs_allocation_len,
                                psbt->outputs_allocation_len,
                                psbt->unknowns.items_allocation_len,
                                output);
    if (ret == WALLY_OK) {
        (*output)->num_inputs = psbt->num_inputs;
        (*output)->num_outputs = psbt->num_outputs;
        ret = psbt_combine(*output, psbt);

        if (ret == WALLY_OK && psbt->tx)
            ret = tx_clone_alloc(psbt->tx, &(*output)->tx);
        if (ret != WALLY_OK) {
            wally_psbt_free(*output);
            *output = NULL;
        }
    }
    return ret;
}